

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disconnect_on_dtor.cpp
# Opt level: O0

int main(void)

{
  __sighandler_t in_RDX;
  __sighandler_t __handler;
  int in_ESI;
  int *value_00;
  int local_b8 [6];
  undefined1 local_a0 [8];
  A a;
  undefined1 local_80 [4];
  int value;
  signal<void_()> signal;
  
  obs::signal<void_()>::signal((signal<void_()> *)local_80,in_ESI,in_RDX);
  a.m_value._4_4_ = 0;
  A::A((A *)local_a0,(signal<void_()> *)local_80,(int *)((long)&a.m_value + 4));
  local_b8[2] = 0;
  expect_eq<int,int>((int *)((long)&a.m_value + 4),local_b8 + 2,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_dtor.cpp"
                     ,0x1c);
  obs::signal<void_()>::operator()<>((signal<void_()> *)local_80);
  local_b8[1] = 1;
  expect_eq<int,int>((int *)((long)&a.m_value + 4),local_b8 + 1,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_dtor.cpp"
                     ,0x1e);
  A::~A((A *)local_a0);
  obs::signal<void_()>::operator()<>((signal<void_()> *)local_80);
  local_b8[0] = 1;
  value_00 = local_b8;
  expect_eq<int,int>((int *)((long)&a.m_value + 4),value_00,
                     "/workspace/llm4binary/github/license_c_cmakelists/dacap[P]observable/tests/disconnect_on_dtor.cpp"
                     ,0x21);
  obs::signal<void_()>::~signal((signal<void_()> *)local_80,(int)value_00,__handler);
  return 0;
}

Assistant:

int main() {
  obs::signal<void()> signal;
  int value = 0;
  {
    A a(signal, value);
    EXPECT_EQ(value, 0);
    signal();
    EXPECT_EQ(value, 1);
  }
  signal();
  EXPECT_EQ(value, 1);
}